

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool __thiscall
google::anon_unknown_1::CommandLineFlag::Validate(CommandLineFlag *this,FlagValue *value)

{
  ValidateFnProto p_Var1;
  char *flagname;
  FlagValue *value_local;
  CommandLineFlag *this_local;
  
  p_Var1 = validate_function(this);
  if (p_Var1 == (ValidateFnProto)0x0) {
    this_local._7_1_ = true;
  }
  else {
    flagname = name(this);
    p_Var1 = validate_function(this);
    this_local._7_1_ = FlagValue::Validate(value,flagname,p_Var1);
  }
  return this_local._7_1_;
}

Assistant:

bool CommandLineFlag::Validate(const FlagValue& value) const {

  if (validate_function() == NULL)
    return true;
  else
    return value.Validate(name(), validate_function());
}